

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::VarintParse<unsigned_long>(char *p,unsigned_long *out)

{
  byte bVar1;
  ulong *in_RSI;
  byte *in_RDI;
  uint32 byte;
  uint32 res;
  uint8 *ptr;
  byte *local_8;
  
  bVar1 = *in_RDI;
  if ((bVar1 & 0x80) == 0) {
    *in_RSI = (ulong)(uint)bVar1;
    local_8 = in_RDI + 1;
  }
  else if ((in_RDI[1] & 0x80) == 0) {
    *in_RSI = (ulong)((in_RDI[1] - 1) * 0x80 + (uint)bVar1);
    local_8 = in_RDI + 2;
  }
  else {
    local_8 = (byte *)VarintParseSlow((char *)in_RDI,(uint32)((ulong)in_RSI >> 0x20),
                                      (uint64 *)in_RDI);
  }
  return (char *)local_8;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* VarintParse(const char* p, T* out) {
  auto ptr = reinterpret_cast<const uint8*>(p);
  uint32 res = ptr[0];
  if (!(res & 0x80)) {
    *out = res;
    return p + 1;
  }
  uint32 byte = ptr[1];
  res += (byte - 1) << 7;
  if (!(byte & 0x80)) {
    *out = res;
    return p + 2;
  }
  return VarintParseSlow(p, res, out);
}